

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O1

bool slang::ast::isValidAssignLVal(Expression *expr)

{
  Type *pTVar1;
  undefined8 *puVar2;
  bool bVar3;
  Symbol *pSVar4;
  uint uVar5;
  long lVar6;
  byte bVar7;
  
  if (expr->kind - NamedValue < 2) {
    pSVar4 = Expression::getSymbolReference(expr,true);
    if (pSVar4 == (Symbol *)0x0) {
      bVar7 = 1;
      goto LAB_00449bad;
    }
    uVar5 = pSVar4->kind - Variable;
    if (uVar5 < 0x19) {
      bVar7 = (byte)(0x1800c0f >> ((byte)uVar5 & 0x1f));
      goto LAB_00449bad;
    }
  }
  else if (expr->kind == Concatenation) {
    pTVar1 = expr[1].type.ptr;
    bVar7 = pTVar1 == (Type *)0x0;
    if (!(bool)bVar7) {
      puVar2 = *(undefined8 **)(expr + 1);
      bVar3 = isValidAssignLVal((Expression *)*puVar2);
      if (bVar3) {
        lVar6 = 8;
        do {
          bVar7 = (long)pTVar1 << 3 == lVar6;
          if ((bool)bVar7) break;
          bVar3 = isValidAssignLVal(*(Expression **)((long)puVar2 + lVar6));
          lVar6 = lVar6 + 8;
        } while (bVar3);
      }
    }
    goto LAB_00449bad;
  }
  bVar7 = 0;
LAB_00449bad:
  return (bool)(bVar7 & 1);
}

Assistant:

static bool isValidAssignLVal(const Expression& expr) {
    switch (expr.kind) {
        case ExpressionKind::NamedValue:
        case ExpressionKind::HierarchicalValue:
            if (auto sym = expr.getSymbolReference()) {
                if (!VariableSymbol::isKind(sym->kind))
                    return false;
            }
            return true;
        case ExpressionKind::Concatenation:
            for (auto op : expr.as<ConcatenationExpression>().operands()) {
                if (!isValidAssignLVal(*op))
                    return false;
            }
            return true;
        default:
            return false;
    }
}